

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_init(lzh_stream *strm,char *method)

{
  char cVar1;
  int iVar2;
  wchar_t wVar3;
  lzh_dec *plVar4;
  uchar *puVar5;
  int local_2c;
  wchar_t w_size;
  wchar_t w_bits;
  lzh_dec *ds;
  char *method_local;
  lzh_stream *strm_local;
  
  if (strm->ds == (lzh_dec *)0x0) {
    plVar4 = (lzh_dec *)calloc(1,0x158);
    strm->ds = plVar4;
    if (strm->ds == (lzh_dec *)0x0) {
      return L'\xffffffe2';
    }
  }
  plVar4 = strm->ds;
  plVar4->error = L'\xffffffe7';
  if (((method == (char *)0x0) || (*method != 'l')) || (method[1] != 'h')) {
    strm_local._4_4_ = L'\xffffffe7';
  }
  else {
    cVar1 = method[2];
    if (cVar1 == '5') {
      local_2c = 0xd;
    }
    else if (cVar1 == '6') {
      local_2c = 0xf;
    }
    else {
      if (cVar1 != '7') {
        return L'\xffffffe7';
      }
      local_2c = 0x10;
    }
    plVar4->error = L'\xffffffe2';
    plVar4->w_size = L'𠀀';
    plVar4->w_mask = plVar4->w_size + L'\xffffffff';
    if (plVar4->w_buff == (uchar *)0x0) {
      puVar5 = (uchar *)malloc((long)plVar4->w_size);
      plVar4->w_buff = puVar5;
      if (plVar4->w_buff == (uchar *)0x0) {
        return L'\xffffffe2';
      }
    }
    iVar2 = 1 << (sbyte)local_2c;
    memset(plVar4->w_buff + ((long)plVar4->w_size - (long)iVar2),0x20,(long)iVar2);
    plVar4->w_pos = L'\0';
    plVar4->state = L'\0';
    plVar4->pos_pt_len_size = local_2c + L'\x01';
    wVar3 = L'\x04';
    if (local_2c == 0xf || local_2c == 0x10) {
      wVar3 = L'\x05';
    }
    plVar4->pos_pt_len_bits = wVar3;
    plVar4->literal_pt_len_size = L'\x13';
    plVar4->literal_pt_len_bits = L'\x05';
    (plVar4->br).cache_buffer = 0;
    (plVar4->br).cache_avail = L'\0';
    wVar3 = lzh_huffman_init(&plVar4->lt,0x1fe,L'\x10');
    if (wVar3 == L'\0') {
      (plVar4->lt).len_bits = L'\t';
      wVar3 = lzh_huffman_init(&plVar4->pt,0x13,L'\x10');
      if (wVar3 == L'\0') {
        plVar4->error = L'\0';
        strm_local._4_4_ = L'\0';
      }
      else {
        strm_local._4_4_ = L'\xffffffe2';
      }
    }
    else {
      strm_local._4_4_ = L'\xffffffe2';
    }
  }
  return strm_local._4_4_;
}

Assistant:

static int
lzh_decode_init(struct lzh_stream *strm, const char *method)
{
	struct lzh_dec *ds;
	int w_bits, w_size;

	if (strm->ds == NULL) {
		strm->ds = calloc(1, sizeof(*strm->ds));
		if (strm->ds == NULL)
			return (ARCHIVE_FATAL);
	}
	ds = strm->ds;
	ds->error = ARCHIVE_FAILED;
	if (method == NULL || method[0] != 'l' || method[1] != 'h')
		return (ARCHIVE_FAILED);
	switch (method[2]) {
	case '5':
		w_bits = 13;/* 8KiB for window */
		break;
	case '6':
		w_bits = 15;/* 32KiB for window */
		break;
	case '7':
		w_bits = 16;/* 64KiB for window */
		break;
	default:
		return (ARCHIVE_FAILED);/* Not supported. */
	}
	ds->error = ARCHIVE_FATAL;
	/* Expand a window size up to 128 KiB for decompressing process
	 * performance whatever its original window size is. */
	ds->w_size = 1U << 17;
	ds->w_mask = ds->w_size -1;
	if (ds->w_buff == NULL) {
		ds->w_buff = malloc(ds->w_size);
		if (ds->w_buff == NULL)
			return (ARCHIVE_FATAL);
	}
	w_size = 1U << w_bits;
	memset(ds->w_buff + ds->w_size - w_size, 0x20, w_size);
	ds->w_pos = 0;
	ds->state = 0;
	ds->pos_pt_len_size = w_bits + 1;
	ds->pos_pt_len_bits = (w_bits == 15 || w_bits == 16)? 5: 4;
	ds->literal_pt_len_size = PT_BITLEN_SIZE;
	ds->literal_pt_len_bits = 5;
	ds->br.cache_buffer = 0;
	ds->br.cache_avail = 0;

	if (lzh_huffman_init(&(ds->lt), LT_BITLEN_SIZE, 16)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	ds->lt.len_bits = 9;
	if (lzh_huffman_init(&(ds->pt), PT_BITLEN_SIZE, 16)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	ds->error = 0;

	return (ARCHIVE_OK);
}